

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O0

string * trun::rtrim(string *str,string *chars)

{
  size_type sVar1;
  string *chars_local;
  string *str_local;
  
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_not_of(str,chars,0xffffffffffffffff);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (str,sVar1 + 1,0xffffffffffffffff);
  return str;
}

Assistant:

std::string& rtrim(std::string& str, const std::string& chars /* = "\t\n\v\f\r " */) {
        str.erase(str.find_last_not_of(chars) + 1);
        return str;
    }